

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# requantize.cpp
# Opt level: O2

int __thiscall
ncnn::Requantize::forward(Requantize *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  void *pvVar2;
  void *pvVar3;
  size_t sVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  undefined1 uVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  uint uVar14;
  int i;
  ulong uVar15;
  float fVar16;
  float fVar17;
  Mat local_70;
  
  iVar10 = bottom_blob->dims;
  if (iVar10 == 3) {
    uVar14 = bottom_blob->c;
    uVar5 = bottom_blob->h * bottom_blob->w;
    if (this->bias_term == 0) {
      uVar12 = 0;
      uVar15 = (ulong)uVar5;
      if ((int)uVar5 < 1) {
        uVar15 = uVar12;
      }
      uVar8 = (ulong)uVar14;
      if ((int)uVar14 < 1) {
        uVar8 = uVar12;
      }
      for (iVar10 = 0; iVar10 != (int)uVar8; iVar10 = iVar10 + 1) {
        Mat::channel(&local_70,bottom_blob,iVar10);
        pvVar2 = local_70.data;
        Mat::~Mat(&local_70);
        Mat::channel(&local_70,top_blob,iVar10);
        pvVar3 = local_70.data;
        Mat::~Mat(&local_70);
        for (uVar7 = 0; uVar15 != uVar7; uVar7 = uVar7 + 1) {
          fVar16 = roundf((float)*(int *)((long)pvVar2 + uVar7 * 4) * this->scale_in *
                          this->scale_out);
          uVar5 = (uint)fVar16;
          uVar14 = uVar5;
          if ((int)uVar5 < -0x7e) {
            uVar14 = 0xffffff81;
          }
          if (0x7e < (int)uVar14) {
            uVar14 = 0x7f;
          }
          *(char *)((long)pvVar3 + uVar7) = (char)uVar14;
          uVar11 = (ulong)uVar14;
          if (this->fusion_relu != false) {
            uVar11 = uVar12;
          }
          uVar9 = (char)uVar11;
          if (-1 < (int)uVar5) {
            uVar9 = (char)uVar14;
          }
          *(undefined1 *)((long)pvVar3 + uVar7) = uVar9;
        }
      }
    }
    else {
      uVar12 = 0;
      uVar15 = (ulong)uVar5;
      if ((int)uVar5 < 1) {
        uVar15 = uVar12;
      }
      uVar8 = (ulong)uVar14;
      if ((int)uVar14 < 1) {
        uVar8 = uVar12;
      }
      for (uVar14 = 0; uVar14 != (uint)uVar8; uVar14 = uVar14 + 1) {
        Mat::channel(&local_70,bottom_blob,uVar14);
        pvVar2 = local_70.data;
        Mat::~Mat(&local_70);
        Mat::channel(&local_70,top_blob,uVar14);
        pvVar3 = local_70.data;
        Mat::~Mat(&local_70);
        uVar7 = 0;
        if (1 < this->bias_data_size) {
          uVar7 = (ulong)uVar14;
        }
        fVar16 = *(float *)((long)(this->bias_data).data + uVar7 * 4);
        for (uVar7 = 0; uVar15 != uVar7; uVar7 = uVar7 + 1) {
          fVar17 = roundf(((float)*(int *)((long)pvVar2 + uVar7 * 4) * this->scale_in + fVar16) *
                          this->scale_out);
          uVar6 = (uint)fVar17;
          uVar5 = uVar6;
          if ((int)uVar6 < -0x7e) {
            uVar5 = 0xffffff81;
          }
          if (0x7e < (int)uVar5) {
            uVar5 = 0x7f;
          }
          *(char *)((long)pvVar3 + uVar7) = (char)uVar5;
          uVar11 = (ulong)uVar5;
          if (this->fusion_relu != false) {
            uVar11 = uVar12;
          }
          uVar9 = (char)uVar11;
          if (-1 < (int)uVar6) {
            uVar9 = (char)uVar5;
          }
          *(undefined1 *)((long)pvVar3 + uVar7) = uVar9;
        }
      }
    }
  }
  else if (iVar10 == 2) {
    uVar14 = bottom_blob->w;
    uVar5 = bottom_blob->h;
    if (this->bias_term == 0) {
      uVar12 = 0;
      uVar15 = (ulong)uVar14;
      if ((int)uVar14 < 1) {
        uVar15 = uVar12;
      }
      uVar8 = (ulong)uVar5;
      if ((int)uVar5 < 1) {
        uVar8 = uVar12;
      }
      for (iVar10 = 0; iVar10 != (int)uVar8; iVar10 = iVar10 + 1) {
        lVar13 = (long)(top_blob->w * iVar10) * top_blob->elemsize;
        pvVar2 = top_blob->data;
        iVar1 = bottom_blob->w;
        sVar4 = bottom_blob->elemsize;
        pvVar3 = bottom_blob->data;
        for (uVar7 = 0; uVar15 != uVar7; uVar7 = uVar7 + 1) {
          fVar16 = roundf((float)*(int *)((long)pvVar3 + uVar7 * 4 + (long)(iVar1 * iVar10) * sVar4)
                          * this->scale_in * this->scale_out);
          uVar5 = (uint)fVar16;
          uVar14 = uVar5;
          if ((int)uVar5 < -0x7e) {
            uVar14 = 0xffffff81;
          }
          if (0x7e < (int)uVar14) {
            uVar14 = 0x7f;
          }
          *(char *)((long)pvVar2 + uVar7 + lVar13) = (char)uVar14;
          uVar11 = (ulong)uVar14;
          if (this->fusion_relu != false) {
            uVar11 = uVar12;
          }
          uVar9 = (char)uVar11;
          if (-1 < (int)uVar5) {
            uVar9 = (char)uVar14;
          }
          *(undefined1 *)((long)pvVar2 + uVar7 + lVar13) = uVar9;
        }
      }
    }
    else {
      uVar12 = 0;
      uVar15 = (ulong)uVar14;
      if ((int)uVar14 < 1) {
        uVar15 = uVar12;
      }
      uVar8 = (ulong)uVar5;
      if ((int)uVar5 < 1) {
        uVar8 = uVar12;
      }
      for (uVar14 = 0; uVar14 != (uint)uVar8; uVar14 = uVar14 + 1) {
        uVar7 = 0;
        if (1 < this->bias_data_size) {
          uVar7 = (ulong)uVar14;
        }
        lVar13 = (long)(int)(top_blob->w * uVar14) * top_blob->elemsize;
        pvVar2 = top_blob->data;
        iVar10 = bottom_blob->w;
        sVar4 = bottom_blob->elemsize;
        fVar16 = *(float *)((long)(this->bias_data).data + uVar7 * 4);
        pvVar3 = bottom_blob->data;
        for (uVar7 = 0; uVar15 != uVar7; uVar7 = uVar7 + 1) {
          fVar17 = roundf(((float)*(int *)((long)pvVar3 +
                                          uVar7 * 4 + (long)(int)(iVar10 * uVar14) * sVar4) *
                           this->scale_in + fVar16) * this->scale_out);
          uVar6 = (uint)fVar17;
          uVar5 = uVar6;
          if ((int)uVar6 < -0x7e) {
            uVar5 = 0xffffff81;
          }
          if (0x7e < (int)uVar5) {
            uVar5 = 0x7f;
          }
          *(char *)((long)pvVar2 + uVar7 + lVar13) = (char)uVar5;
          uVar11 = (ulong)uVar5;
          if (this->fusion_relu != false) {
            uVar11 = uVar12;
          }
          uVar9 = (char)uVar11;
          if (-1 < (int)uVar6) {
            uVar9 = (char)uVar5;
          }
          *(undefined1 *)((long)pvVar2 + uVar7 + lVar13) = uVar9;
        }
      }
    }
  }
  else if (iVar10 == 1) {
    uVar14 = bottom_blob->w;
    pvVar2 = bottom_blob->data;
    pvVar3 = top_blob->data;
    if (this->bias_term == 0) {
      uVar15 = (ulong)uVar14;
      if ((int)uVar14 < 1) {
        uVar15 = 0;
      }
      for (uVar12 = 0; uVar15 != uVar12; uVar12 = uVar12 + 1) {
        fVar16 = roundf((float)*(int *)((long)pvVar2 + uVar12 * 4) * this->scale_in *
                        this->scale_out);
        uVar5 = (uint)fVar16;
        uVar14 = uVar5;
        if ((int)uVar5 < -0x7e) {
          uVar14 = 0xffffff81;
        }
        if (0x7e < (int)uVar14) {
          uVar14 = 0x7f;
        }
        *(char *)((long)pvVar3 + uVar12) = (char)uVar14;
        uVar8 = (ulong)uVar14;
        if (this->fusion_relu != false) {
          uVar8 = 0;
        }
        uVar9 = (char)uVar8;
        if (-1 < (int)uVar5) {
          uVar9 = (char)uVar14;
        }
        *(undefined1 *)((long)pvVar3 + uVar12) = uVar9;
      }
    }
    else if (this->bias_data_size < 2) {
      uVar15 = (ulong)uVar14;
      if ((int)uVar14 < 1) {
        uVar15 = 0;
      }
      fVar16 = *(this->bias_data).data;
      for (uVar12 = 0; uVar15 != uVar12; uVar12 = uVar12 + 1) {
        fVar17 = roundf(((float)*(int *)((long)pvVar2 + uVar12 * 4) * this->scale_in + fVar16) *
                        this->scale_out);
        uVar5 = (uint)fVar17;
        uVar14 = uVar5;
        if ((int)uVar5 < -0x7e) {
          uVar14 = 0xffffff81;
        }
        if (0x7e < (int)uVar14) {
          uVar14 = 0x7f;
        }
        *(char *)((long)pvVar3 + uVar12) = (char)uVar14;
        uVar8 = (ulong)uVar14;
        if (this->fusion_relu != false) {
          uVar8 = 0;
        }
        uVar9 = (char)uVar8;
        if (-1 < (int)uVar5) {
          uVar9 = (char)uVar14;
        }
        *(undefined1 *)((long)pvVar3 + uVar12) = uVar9;
      }
    }
    else {
      uVar15 = (ulong)uVar14;
      if ((int)uVar14 < 1) {
        uVar15 = 0;
      }
      for (uVar12 = 0; uVar15 != uVar12; uVar12 = uVar12 + 1) {
        fVar16 = roundf(((float)*(int *)((long)pvVar2 + uVar12 * 4) * this->scale_in +
                        *(float *)((long)(this->bias_data).data + uVar12 * 4)) * this->scale_out);
        uVar5 = (uint)fVar16;
        uVar14 = uVar5;
        if ((int)uVar5 < -0x7e) {
          uVar14 = 0xffffff81;
        }
        if (0x7e < (int)uVar14) {
          uVar14 = 0x7f;
        }
        *(char *)((long)pvVar3 + uVar12) = (char)uVar14;
        uVar8 = (ulong)uVar14;
        if (this->fusion_relu != false) {
          uVar8 = 0;
        }
        uVar9 = (char)uVar8;
        if (-1 < (int)uVar5) {
          uVar9 = (char)uVar14;
        }
        *(undefined1 *)((long)pvVar3 + uVar12) = uVar9;
      }
    }
  }
  return 0;
}

Assistant:

int Requantize::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{ 
    int dims = bottom_blob.dims;

    if (dims == 1)
    {
        int w = bottom_blob.w;

        const int* intptr = bottom_blob;
        signed char * ptr = top_blob;

        if (bias_term)
        {
            if (bias_data_size > 1)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i=0; i<w; i++)
                {
                    ptr[i] = float2int8(((intptr[i] * scale_in) + bias_data[i]) * scale_out);
                    if (fusion_relu && ptr[i] < 0)
                        ptr[i] = 0;
                }
            }
            else
            {
                float bias = bias_data[0];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i=0; i<w; i++)
                {
                    ptr[i] = float2int8(((intptr[i] * scale_in) + bias) * scale_out);
                    if (fusion_relu && ptr[i] < 0)
                        ptr[i] = 0;
                }
            }
        }
        else
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i=0; i<w; i++)
            {
                ptr[i] = float2int8(intptr[i] * scale_in * scale_out);
                if (fusion_relu && ptr[i] < 0)
                    ptr[i] = 0;
            }
        }
    }

    if (dims == 2)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;

        if (bias_term)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i=0; i<h; i++)
            {
                const int* intptr = bottom_blob.row<const int>(i);
                signed char* ptr = top_blob.row<signed char>(i);

                float bias = bias_data_size > 1 ? bias_data[i] : bias_data[0];

                for (int j=0; j<w; j++)
                {
                    ptr[j] = float2int8(((intptr[j] * scale_in) + bias) * scale_out);
                    if (fusion_relu && ptr[j] < 0)
                        ptr[j] = 0;
                }
            }
        }
        else
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i=0; i<h; i++)
            {
                const int* intptr = bottom_blob.row<const int>(i);
                signed char* ptr = top_blob.row<signed char>(i);

                for (int j=0; j<w; j++)
                {
                    ptr[j] = float2int8(intptr[j] * scale_in * scale_out);
                    if (fusion_relu && ptr[j] < 0)
                        ptr[j] = 0;
                }
            }
        }
    }

    if (dims == 3)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int channels = bottom_blob.c;
        int size = w * h;      

        if (bias_term)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const int* intptr = bottom_blob.channel(q);
                signed char* ptr = top_blob.channel(q);

                float bias = bias_data_size > 1 ? bias_data[q] : bias_data[0];

                for (int i=0; i<size; i++)
                {
                    ptr[i] = float2int8(((intptr[i] * scale_in) + bias) * scale_out);
                    if (fusion_relu && ptr[i] < 0)
                        ptr[i] = 0;
                }
            }
        }
        else
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const int* intptr = bottom_blob.channel(q);
                signed char* ptr = top_blob.channel(q);

                for (int i=0; i<size; i++)
                {
                    ptr[i] = float2int8(intptr[i] * scale_in * scale_out);
                    if (fusion_relu && ptr[i] < 0)
                        ptr[i] = 0;
                }
            }
        }    
    }

    return 0;
}